

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSTFile.cpp
# Opt level: O0

string * read_string_abi_cxx11_(char **p,int size)

{
  char *pcVar1;
  int in_EDX;
  long *in_RSI;
  string *in_RDI;
  string *s;
  allocator local_16;
  undefined1 local_15;
  int local_14;
  long *local_10;
  
  local_15 = 0;
  pcVar1 = (char *)*in_RSI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,(long)in_EDX,&local_16);
  std::allocator<char>::~allocator((allocator<char> *)&local_16);
  *local_10 = *local_10 + (long)local_14;
  return in_RDI;
}

Assistant:

std::string read_string(char *&p, int size) {
	std::string s(p, size);
	p += size;
	return s;
}